

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_deserialize_struct
          (t_perl_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  t_program *p;
  string *psVar2;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_perl_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"$");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," = ");
  p = t_type::get_program((t_type *)prefix_local);
  perl_namespace_abi_cxx11_(&local_78,this,p);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  psVar2 = (string *)(**(code **)(*(long *)prefix_local + 0x18))();
  poVar1 = std::operator<<(poVar1,psVar2);
  poVar1 = std::operator<<(poVar1,"->new();");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1,"$xfer += $");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"->read($input);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_perl_generator::generate_deserialize_struct(ostream& out,
                                                   t_struct* tstruct,
                                                   string prefix) {
  out << indent() << "$" << prefix << " = " << perl_namespace(tstruct->get_program())
      << tstruct->get_name() << "->new();" << endl << indent() << "$xfer += $" << prefix
      << "->read($input);" << endl;
}